

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.h
# Opt level: O2

bool __thiscall Expression::evaluateInteger<int>(Expression *this,int *dest)

{
  ExpressionInternal *this_00;
  bool bVar1;
  ExpressionValue value;
  undefined1 local_40 [48];
  
  this_00 = (this->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (ExpressionInternal *)0x0) {
    bVar1 = false;
  }
  else {
    ExpressionInternal::evaluate((ExpressionValue *)local_40,this_00);
    bVar1 = local_40._0_4_ == Integer;
    if (bVar1) {
      *dest = local_40._8_4_;
    }
    std::__cxx11::string::~string((string *)(local_40 + 0x10));
  }
  return bVar1;
}

Assistant:

bool evaluateInteger(T& dest)
	{
		if (expression == nullptr)
			return false;

		ExpressionValue value = expression->evaluate();
		if (value.isInt() == false)
			return false;

		dest = (T) value.intValue;
		return true;
	}